

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_hdwallet.cpp
# Opt level: O2

string * __thiscall
cfd::api::HDWalletApi::GetPrivkeyFromExtkey
          (string *__return_storage_ptr__,HDWalletApi *this,string *extkey,NetType net_type,bool wif
          ,bool is_compressed)

{
  uint32_t uVar1;
  CfdException *this_00;
  uint32_t uVar2;
  uint32_t local_c4;
  Privkey privkey;
  ExtPrivkey ext_privkey;
  
  core::ExtPrivkey::ExtPrivkey(&ext_privkey,extkey);
  uVar1 = core::ExtPrivkey::GetVersion(&ext_privkey);
  uVar2 = 0x4358394;
  if (net_type == kLiquidV1) {
    uVar2 = 0x488ade4;
  }
  if (net_type == kMainnet) {
    uVar2 = 0x488ade4;
  }
  if (uVar1 == uVar2) {
    core::ExtPrivkey::GetPrivkey(&privkey,&ext_privkey);
    if (wif) {
      core::Privkey::ConvertWif_abi_cxx11_(__return_storage_ptr__,&privkey,net_type,is_compressed);
    }
    else {
      core::Privkey::GetHex_abi_cxx11_(__return_storage_ptr__,&privkey);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&privkey);
    core::ExtPrivkey::~ExtPrivkey(&ext_privkey);
    return __return_storage_ptr__;
  }
  privkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "cfdapi_hdwallet.cpp";
  privkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x134;
  privkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = "GetPrivkeyFromExtkey";
  local_c4 = core::ExtPrivkey::GetVersion(&ext_privkey);
  core::logger::warn<unsigned_int>
            ((CfdSourceLocation *)&privkey,"Version unmatch. key version: {}",&local_c4);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&privkey,"extkey networkType unmatch.",(allocator *)&local_c4);
  core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&privkey);
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

std::string HDWalletApi::GetPrivkeyFromExtkey(
    const std::string& extkey, NetType net_type, bool wif,
    bool is_compressed) const {
  ExtPrivkey ext_privkey(extkey);
  uint32_t check_version = GetExtkeyVersion(ExtKeyType::kExtPrivkey, net_type);
  if (ext_privkey.GetVersion() != check_version) {
    warn(
        CFD_LOG_SOURCE, "Version unmatch. key version: {}",
        ext_privkey.GetVersion());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "extkey networkType unmatch.");
  }

  Privkey privkey = ext_privkey.GetPrivkey();
  if (wif) {
    return privkey.ConvertWif(net_type, is_compressed);
  } else {
    return privkey.GetHex();
  }
}